

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int64_t expand(archive_read *a,int64_t end)

{
  long *plVar1;
  byte bVar2;
  void *pvVar3;
  undefined8 uVar4;
  rar_program_code *prVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint32_t uVar14;
  uint8_t *puVar15;
  byte *pbVar16;
  rar_program_code *prog;
  uLong uVar17;
  undefined4 extraout_var;
  undefined8 *puVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long *plVar25;
  uint8_t uVar26;
  uint uVar27;
  uint uVar28;
  void *pvVar29;
  size_t __size;
  void *pvVar30;
  byte *__size_00;
  uint64_t uVar31;
  byte *pbVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  uint8_t flags;
  byte local_139;
  archive_read *local_138;
  byte local_129;
  ulong local_128;
  uint32_t local_11c;
  byte *local_118;
  int *local_110;
  rar_br *local_108;
  memory_bit_reader local_100;
  void *local_d8;
  byte *local_d0;
  uint8_t *local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint32_t uStack_a8;
  uint32_t uStack_a4;
  undefined8 uStack_a0;
  long local_90;
  undefined8 *local_88;
  memory_bit_reader local_80;
  void *local_58;
  huffman_code *local_50;
  huffman_code *local_48;
  huffman_code *local_40;
  huffman_code *local_38;
  
  pvVar3 = a->format->data;
  local_c0 = end;
  if (*(long *)((long)pvVar3 + 0x3a8) < end) {
    local_c0 = *(long *)((long)pvVar3 + 0x3a8);
  }
  lVar22 = local_c0;
  if ((*(long *)((long)pvVar3 + 0x360) < local_c0) &&
     (lVar22 = *(long *)((long)pvVar3 + 0x360), *(char *)((long)pvVar3 + 0x3d2) == '\0')) {
    local_108 = (rar_br *)((long)pvVar3 + 0x4f30);
    local_38 = (huffman_code *)((long)pvVar3 + 0x118);
    local_48 = (huffman_code *)((long)pvVar3 + 0x140);
    local_50 = (huffman_code *)((long)pvVar3 + 0x168);
    local_110 = (int *)((long)pvVar3 + 0x370);
    local_40 = (huffman_code *)((long)pvVar3 + 400);
    local_88 = (undefined8 *)((long)pvVar3 + 0x374);
    local_138 = a;
    do {
      uVar8 = read_next_symbol(a,local_38);
      if ((int)uVar8 < 0) {
        return -0x1e;
      }
      if (uVar8 < 0x100) {
        *(char *)(*(long *)((long)pvVar3 + 0x350) +
                 (long)(int)(*(uint *)((long)pvVar3 + 0x358) & *(uint *)((long)pvVar3 + 0x360))) =
             (char)uVar8;
        lVar22 = *(long *)((long)pvVar3 + 0x360) + 1;
LAB_0015112e:
        *(long *)((long)pvVar3 + 0x360) = lVar22;
LAB_00151136:
        lVar22 = *(long *)((long)pvVar3 + 0x360);
        if (local_c0 <= lVar22) {
          return local_c0;
        }
      }
      else {
        if (uVar8 == 0x100) {
          iVar11 = *(int *)((long)pvVar3 + 0x4f38);
          if (iVar11 < 1) {
            iVar20 = rar_br_fillup(local_138,local_108);
            iVar11 = *(int *)((long)pvVar3 + 0x4f38);
            if (iVar11 < 1 && iVar20 == 0) goto LAB_001519f2;
          }
          a = local_138;
          uVar8 = iVar11 - 1;
          *(uint *)((long)pvVar3 + 0x4f38) = uVar8;
          if ((*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
            *(undefined1 *)((long)pvVar3 + 0xec) = 1;
            if (iVar11 < 2) {
              iVar11 = rar_br_fillup(local_138,local_108);
              uVar8 = *(uint *)((long)pvVar3 + 0x4f38);
              if ((int)uVar8 < 1 && iVar11 == 0) goto LAB_001519f2;
            }
            *(bool *)((long)pvVar3 + 0x388) =
                 (*(ulong *)((long)pvVar3 + 0x4f30) >> ((ulong)(uVar8 - 1) & 0x3f) & 1) != 0;
            *(uint *)((long)pvVar3 + 0x4f38) = uVar8 - 1;
            return *(int64_t *)((long)pvVar3 + 0x360);
          }
          iVar11 = parse_codes(local_138);
          if (iVar11 != 0) {
            return -0x1e;
          }
          goto LAB_00151136;
        }
        if (uVar8 == 0x102) {
          uVar28 = *(uint *)((long)pvVar3 + 0x368);
          if (uVar28 != 0) {
            iVar11 = *(int *)((long)pvVar3 + 0x36c);
LAB_00151073:
            *(int *)((long)pvVar3 + 0x36c) = iVar11;
            *(uint *)((long)pvVar3 + 0x368) = uVar28;
            lVar22 = *(long *)((long)pvVar3 + 0x360);
            if (0 < (int)uVar28) goto LAB_00151093;
            goto LAB_00151128;
          }
          goto LAB_00151136;
        }
        if (uVar8 != 0x101) {
          if (uVar8 < 0x107) {
            iVar11 = local_110[uVar8 - 0x103];
            uVar9 = read_next_symbol(a,local_40);
            if (0x1c < uVar9) goto LAB_00151976;
            uVar28 = ""[uVar9] + 2;
            if (7 < uVar9) {
              bVar7 = ""[uVar9];
              iVar20 = *(int *)((long)pvVar3 + 0x4f38);
              uVar9 = (uint)bVar7;
              if (iVar20 < (int)(uint)bVar7) {
                local_128 = CONCAT44(local_128._4_4_,(uint)bVar7);
                iVar10 = rar_br_fillup(local_138,local_108);
                iVar20 = *(int *)((long)pvVar3 + 0x4f38);
                uVar9 = (uint)local_128;
                if ((iVar10 == 0) && (iVar20 < (int)(uint)local_128)) goto LAB_001519f2;
              }
              uVar28 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)(iVar20 - uVar9) & 0x3f))
                       & cache_masks[uVar9]) + uVar28;
              *(uint *)((long)pvVar3 + 0x4f38) = iVar20 - uVar9;
            }
            uVar23 = (ulong)(uVar8 - 0x103);
            if (0x103 < uVar8) {
              do {
                local_110[uVar23] = local_110[uVar23 - 1];
                bVar6 = 1 < uVar23;
                uVar23 = uVar23 - 1;
              } while (bVar6);
            }
            *local_110 = iVar11;
            a = local_138;
            goto LAB_00151073;
          }
          if (0x10e < uVar8) {
            if (299 < uVar8) {
LAB_00151976:
              archive_set_error(&local_138->archive,0x54,"Bad RAR file data");
              return -0x1e;
            }
            uVar8 = uVar8 - 0x10f;
            iVar20 = ""[uVar8] + 3;
            if (7 < uVar8) {
              bVar7 = ""[uVar8];
              iVar11 = *(int *)((long)pvVar3 + 0x4f38);
              if (iVar11 < (int)(uint)bVar7) {
                iVar10 = rar_br_fillup(local_138,local_108);
                iVar11 = *(int *)((long)pvVar3 + 0x4f38);
                if ((iVar10 == 0) && (iVar11 < (int)(uint)bVar7)) goto LAB_001519f2;
              }
              iVar11 = iVar11 - (uint)bVar7;
              iVar20 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar11 & 0x3f)) &
                       cache_masks[bVar7]) + iVar20;
              *(int *)((long)pvVar3 + 0x4f38) = iVar11;
            }
            uVar8 = read_next_symbol(local_138,local_48);
            if (0x3c < uVar8) goto LAB_00151976;
            uVar23 = (ulong)uVar8;
            iVar11 = expand::offsetbases[uVar23] + 1;
            a = local_138;
            if (3 < uVar8) {
              bVar7 = ""[uVar23];
              if (uVar8 < 10) {
                iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                if (iVar10 < (int)(uint)bVar7) {
                  iVar35 = rar_br_fillup(local_138,local_108);
                  iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                  if ((iVar35 == 0) && (iVar10 < (int)(uint)bVar7)) {
LAB_001519f2:
                    archive_set_error(&local_138->archive,0x54,"Truncated RAR file data");
                    *(undefined1 *)((long)pvVar3 + 0xd0) = 0;
                    return -0x1e;
                  }
                }
                iVar10 = iVar10 - (uint)bVar7;
                iVar11 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar10 & 0x3f)) &
                         cache_masks[bVar7]) + iVar11;
                *(int *)((long)pvVar3 + 0x4f38) = iVar10;
                a = local_138;
              }
              else {
                if (uVar23 - 0xc < 0x30) {
                  iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                  iVar35 = bVar7 - 4;
                  if (iVar10 < iVar35) {
                    iVar12 = rar_br_fillup(local_138,local_108);
                    iVar10 = *(int *)((long)pvVar3 + 0x4f38);
                    if ((iVar12 == 0) && (iVar10 < iVar35)) goto LAB_001519f2;
                  }
                  iVar11 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >>
                                  ((byte)(iVar10 - iVar35) & 0x3f)) &
                           *(uint *)("" + (ulong)bVar7 * 4 + 1)) * 0x10 + iVar11;
                  *(int *)((long)pvVar3 + 0x4f38) = iVar10 - iVar35;
                }
                a = local_138;
                if (*(int *)((long)pvVar3 + 900) == 0) {
                  iVar10 = read_next_symbol(local_138,local_50);
                  if (iVar10 < 0) {
                    return -0x1e;
                  }
                  if (iVar10 != 0x10) {
                    iVar11 = iVar11 + iVar10;
                    *(int *)((long)pvVar3 + 0x380) = iVar10;
                    goto LAB_0015103d;
                  }
                  *(undefined4 *)((long)pvVar3 + 900) = 0xf;
                }
                else {
                  *(int *)((long)pvVar3 + 900) = *(int *)((long)pvVar3 + 900) + -1;
                }
                iVar11 = iVar11 + *(int *)((long)pvVar3 + 0x380);
              }
            }
LAB_0015103d:
            uVar4 = *(undefined8 *)local_110;
            *(int *)(local_88 + 1) = local_110[2];
            *local_88 = uVar4;
            uVar28 = iVar20 + (uint)(0x3ffff < iVar11) + (uint)(0x1fff < iVar11);
            *local_110 = iVar11;
            goto LAB_00151073;
          }
          bVar7 = ""[uVar8 - 0x107];
          bVar2 = "\x02\x02\x03\x04\x05\x06\x06\x06"[uVar8 - 0x107];
          iVar20 = *(int *)((long)pvVar3 + 0x4f38);
          if (iVar20 < (int)(uint)bVar2) {
            iVar11 = rar_br_fillup(local_138,local_108);
            iVar20 = *(int *)((long)pvVar3 + 0x4f38);
            if ((iVar11 == 0) && (iVar20 < (int)(uint)bVar2)) goto LAB_001519f2;
          }
          iVar20 = iVar20 - (uint)bVar2;
          iVar11 = ((uint)(*(ulong *)((long)pvVar3 + 0x4f30) >> ((byte)iVar20 & 0x3f)) &
                   cache_masks[bVar2]) + bVar7 + 1;
          *(int *)((long)pvVar3 + 0x4f38) = iVar20;
          uVar4 = *(undefined8 *)local_110;
          *(int *)(local_88 + 1) = local_110[2];
          *local_88 = uVar4;
          *(int *)((long)pvVar3 + 0x370) = iVar11;
          *(int *)((long)pvVar3 + 0x36c) = iVar11;
          *(undefined4 *)((long)pvVar3 + 0x368) = 2;
          lVar22 = *(long *)((long)pvVar3 + 0x360);
          uVar28 = 2;
LAB_00151093:
          uVar8 = *(uint *)((long)pvVar3 + 0x358);
          uVar13 = (uint)lVar22 & uVar8;
          uVar36 = uVar13 - iVar11 & uVar8;
          uVar9 = uVar28;
          do {
            uVar21 = uVar36;
            if ((int)uVar36 < (int)uVar13) {
              uVar21 = uVar13;
            }
            uVar21 = (uVar8 - uVar21) + 1;
            if ((int)uVar9 < (int)uVar21) {
              uVar21 = uVar9;
            }
            pvVar30 = (void *)((long)(int)uVar13 + *(long *)((long)pvVar3 + 0x350));
            pvVar29 = (void *)(*(long *)((long)pvVar3 + 0x350) + (long)(int)uVar36);
            if (((int)(uVar21 + uVar13) < (int)uVar36) || ((int)(uVar21 + uVar36) < (int)uVar13)) {
              memcpy(pvVar30,pvVar29,(long)(int)uVar21);
            }
            else if (0 < (int)uVar21) {
              uVar23 = 0;
              do {
                *(undefined1 *)((long)pvVar30 + uVar23) = *(undefined1 *)((long)pvVar29 + uVar23);
                uVar23 = uVar23 + 1;
              } while (uVar21 != uVar23);
            }
            uVar8 = *(uint *)((long)pvVar3 + 0x358);
            uVar13 = uVar21 + uVar13 & uVar8;
            uVar36 = uVar21 + uVar36 & uVar8;
            uVar27 = uVar9 - uVar21;
            bVar6 = (int)uVar21 <= (int)uVar9;
            uVar9 = uVar27;
          } while (uVar27 != 0 && bVar6);
          lVar22 = *(long *)((long)pvVar3 + 0x360);
          a = local_138;
LAB_00151128:
          lVar22 = (int)uVar28 + lVar22;
          goto LAB_0015112e;
        }
        pvVar29 = a->format->data;
        iVar11 = rar_decode_byte(a,&local_129);
        if (iVar11 == 0) {
          return -0x1e;
        }
        local_128 = CONCAT44(local_128._4_4_,(uint)local_129);
        uVar8 = (local_129 & 7) + 1;
        if ((char)uVar8 == '\a') {
          iVar11 = rar_decode_byte(a,&local_139);
          if (iVar11 == 0) {
            return -0x1e;
          }
          uVar8 = local_139 + 7;
        }
        else if ((char)uVar8 == '\b') {
          iVar11 = rar_decode_byte(a,&local_139);
          bVar7 = local_139;
          if (iVar11 == 0) {
            return -0x1e;
          }
          iVar11 = rar_decode_byte(a,&local_139);
          if (iVar11 == 0) {
            return -0x1e;
          }
          uVar8 = (uint)CONCAT11(bVar7,local_139);
        }
        uVar24 = (ulong)uVar8;
        puVar15 = (uint8_t *)malloc(uVar24);
        local_58 = pvVar29;
        local_c8 = puVar15;
        uVar23 = uVar24;
        if (puVar15 == (uint8_t *)0x0) {
          return -0x1e;
        }
        for (; uVar23 != 0; uVar23 = uVar23 - 1) {
          iVar11 = rar_decode_byte(a,puVar15);
          if (iVar11 == 0) goto LAB_00151a41;
          puVar15 = puVar15 + 1;
        }
        pvVar29 = a->format->data;
        local_100.offset = 0;
        local_100.bits = 0;
        local_100.available = 0;
        local_100.at_eof = 0;
        uStack_a8 = 0;
        uStack_a4 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        uVar8 = 0;
        prog = *(rar_program_code **)((long)pvVar29 + 0x398);
        for (prVar5 = prog; prVar5 != (rar_program_code *)0x0; prVar5 = prVar5->next) {
          uVar8 = uVar8 + 1;
        }
        local_100.bytes = local_c8;
        local_100.length = uVar24;
        local_d8 = pvVar29;
        if ((char)local_128 < '\0') {
          uVar14 = membr_next_rarvm_number(&local_100);
          if (uVar14 == 0) {
            delete_filter(*(rar_filter **)((long)pvVar29 + 0x3a0));
            prog = (rar_program_code *)0x0;
            *(undefined8 *)((long)pvVar29 + 0x3a0) = 0;
            delete_program_code(*(rar_program_code **)((long)pvVar29 + 0x398));
            *(undefined8 *)((long)pvVar29 + 0x398) = 0;
            uVar28 = 0;
          }
          else {
            uVar28 = uVar14 - 1;
            if (uVar8 < uVar28) goto LAB_00151a41;
          }
          *(uint *)((long)local_d8 + 0x3b0) = uVar28;
        }
        else {
          uVar28 = *(uint *)((long)pvVar29 + 0x3b0);
        }
        for (; pvVar29 = local_d8, uVar28 != 0; uVar28 = uVar28 - 1) {
          prog = prog->next;
        }
        if (prog != (rar_program_code *)0x0) {
          prog->usagecount = prog->usagecount + 1;
        }
        uVar14 = membr_next_rarvm_number(&local_100);
        local_90 = *(long *)((long)pvVar29 + 0x360) + 0x102;
        if ((local_128 & 0x40) == 0) {
          local_90 = *(long *)((long)pvVar29 + 0x360);
        }
        local_90 = local_90 + (ulong)uVar14;
        if ((local_128 & 0x20) == 0) {
          if (prog != (rar_program_code *)0x0) {
            uStack_a8 = prog->oldfilterlength;
            goto LAB_00151357;
          }
          uStack_a8 = 0;
LAB_00151371:
          uStack_a4 = 0;
        }
        else {
          uStack_a8 = membr_next_rarvm_number(&local_100);
          if (prog == (rar_program_code *)0x0) goto LAB_00151371;
LAB_00151357:
          uStack_a4 = prog->usagecount;
        }
        uStack_ac = 0x3c000;
        uStack_a0 = CONCAT44(0x40000,(undefined4)uStack_a0);
        local_11c = uStack_a8;
        if ((local_128 & 0x10) != 0) {
          if (local_100.available < 7) {
            uVar8 = 0;
            if (local_100.at_eof == 0) {
              iVar11 = local_100.available;
              uVar23 = local_100.offset;
              if (local_100.offset < local_100.length) {
                do {
                  uVar24 = uVar23 + 1;
                  local_100.bits = (ulong)local_100.bytes[uVar23] | local_100.bits << 8;
                  local_100.available = iVar11 + 8;
                  local_100.offset = uVar24;
                  if (-2 < iVar11) goto LAB_00151418;
                  local_100.offset = local_100.length;
                  iVar11 = local_100.available;
                  uVar23 = uVar24;
                } while (uVar24 != local_100.length);
              }
              local_100.at_eof = 1;
            }
          }
          else {
LAB_00151418:
            local_100.available = local_100.available + -7;
            uVar8 = (uint)(local_100.bits >> ((byte)local_100.available & 0x3f)) & 0x7f;
          }
          lVar22 = 0;
          do {
            if ((uVar8 >> ((uint)lVar22 & 0x1f) & 1) != 0) {
              uVar14 = membr_next_rarvm_number(&local_100);
              *(uint32_t *)((long)&local_b8 + lVar22 * 4) = uVar14;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 7);
        }
        a = local_138;
        if (prog == (rar_program_code *)0x0) {
          uVar14 = membr_next_rarvm_number(&local_100);
          if (uVar14 - 0x10001 < 0xffff0000) goto LAB_00151a41;
          __size_00 = (byte *)(ulong)uVar14;
          pbVar16 = (byte *)malloc((size_t)__size_00);
          if (pbVar16 == (byte *)0x0) goto LAB_00151a41;
          plVar1 = (long *)((long)local_d8 + 0x398);
          pbVar32 = (byte *)0x0;
          do {
            if (local_100.available < 8) {
              if (local_100.at_eof == 0) {
                uVar23 = local_100.offset;
                uVar24 = local_100.offset;
                if (local_100.offset < local_100.length) {
                  do {
                    local_100.offset = uVar24 + 1;
                    local_100.bits = (ulong)local_100.bytes[uVar24] | local_100.bits << 8;
                    if (-1 < local_100.available) goto LAB_001514d1;
                    local_100.available = local_100.available + 8;
                    uVar23 = local_100.length;
                    uVar24 = local_100.offset;
                  } while (local_100.offset != local_100.length);
                }
                bVar7 = 0;
                local_100.at_eof = 1;
                local_100.offset = uVar23;
              }
              else {
                bVar7 = 0;
              }
            }
            else {
              local_100.available = local_100.available + -8;
LAB_001514d1:
              bVar7 = (byte)(local_100.bits >> ((byte)local_100.available & 0x3f));
            }
            pbVar16[(long)pbVar32] = bVar7;
            pbVar32 = pbVar32 + 1;
          } while (pbVar32 != __size_00);
          local_80.available = 7;
          local_80.at_eof = 0;
          if (uVar14 < 2) {
            bVar7 = 0;
          }
          else {
            pbVar32 = (byte *)0x1;
            bVar7 = 0;
            do {
              bVar7 = bVar7 ^ pbVar16[(long)pbVar32];
              pbVar32 = pbVar32 + 1;
            } while (__size_00 != pbVar32);
          }
          local_118 = (byte *)(ulong)uVar14;
          if ((bVar7 == *pbVar16) &&
             (local_80.bytes = pbVar16, local_80.length = (size_t)__size_00,
             prog = (rar_program_code *)calloc(1,0x38), prog != (rar_program_code *)0x0)) {
            local_d0 = pbVar16;
            uVar17 = cm_zlib_z_crc32(0,pbVar16,(uInt)local_118);
            prog->fingerprint = (long)__size_00 << 0x20 | uVar17;
            if ((int)local_118 != 1) {
              local_80.bits = (uint64_t)local_d0[1];
              local_80.offset = 2;
              if ((char)local_d0[1] < '\0') {
                uVar14 = membr_next_rarvm_number(&local_80);
                uVar23 = (ulong)(uVar14 + 1);
                prog->staticdatalen = uVar14 + 1;
                puVar15 = (uint8_t *)malloc(uVar23);
                prog->staticdata = puVar15;
                if (puVar15 == (uint8_t *)0x0) {
                  delete_program_code(prog);
                  pbVar16 = local_d0;
                  goto LAB_00151a3c;
                }
                if (uVar23 != 0) {
                  local_118 = (byte *)local_80.length;
                  uVar24 = 0;
                  pbVar16 = (byte *)local_80.offset;
                  uVar31 = local_80.bits;
                  iVar11 = local_80.available;
                  iVar20 = local_80.at_eof;
                  do {
                    if (iVar11 < 8) {
                      if (iVar20 == 0) {
                        if (pbVar16 < local_80.length) {
                          do {
                            pbVar16 = pbVar16 + 1;
                            uVar31 = (ulong)(local_80.bytes + -1)[(long)pbVar16] | uVar31 << 8;
                            if (-1 < iVar11) goto LAB_001518e9;
                            iVar11 = iVar11 + 8;
                          } while (pbVar16 != (byte *)local_80.length);
                          uVar26 = '\0';
                          iVar20 = 1;
                          pbVar16 = (byte *)local_80.length;
                        }
                        else {
                          uVar26 = '\0';
                          iVar20 = 1;
                        }
                      }
                      else {
                        uVar26 = '\0';
                      }
                    }
                    else {
                      iVar11 = iVar11 + -8;
LAB_001518e9:
                      uVar26 = (uint8_t)(uVar31 >> ((byte)iVar11 & 0x3f));
                    }
                    puVar15[uVar24] = uVar26;
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != uVar23);
                }
              }
            }
            free(local_d0);
            do {
              plVar25 = plVar1;
              lVar22 = *plVar25;
              plVar1 = (long *)(lVar22 + 0x30);
            } while (lVar22 != 0);
            *plVar25 = (long)prog;
            goto LAB_0015160e;
          }
LAB_00151a3c:
          free(pbVar16);
LAB_00151a41:
          free(local_c8);
          return -0x1e;
        }
LAB_0015160e:
        prog->oldfilterlength = local_11c;
        if ((local_128 & 8) == 0) {
          pbVar16 = (byte *)0x0;
          uVar23 = 0;
          iVar11 = local_100.at_eof;
        }
        else {
          uVar14 = membr_next_rarvm_number(&local_100);
          if ((0x1fc0 < uVar14) ||
             (local_128 = CONCAT44(extraout_var,uVar14),
             pbVar16 = (byte *)malloc((ulong)(uVar14 + 0x40)), pbVar16 == (byte *)0x0))
          goto LAB_00151a41;
          if ((int)local_128 == 0) {
            uVar23 = 0;
            iVar11 = local_100.at_eof;
          }
          else {
            uVar24 = 0;
            uVar31 = local_100.bits;
            uVar23 = local_100.offset;
            iVar11 = local_100.available;
            do {
              if (iVar11 < 8) {
                if (local_100.at_eof == 0) {
                  uVar34 = uVar23;
                  uVar33 = uVar23;
                  if (uVar23 < local_100.length) {
                    do {
                      uVar23 = uVar33 + 1;
                      uVar31 = (ulong)local_100.bytes[uVar33] | uVar31 << 8;
                      if (-1 < iVar11) goto LAB_0015169c;
                      iVar11 = iVar11 + 8;
                      uVar34 = local_100.length;
                      uVar33 = uVar23;
                    } while (uVar23 != local_100.length);
                  }
                  bVar7 = 0;
                  local_100.at_eof = 1;
                  uVar23 = uVar34;
                }
                else {
                  bVar7 = 0;
                }
              }
              else {
                iVar11 = iVar11 + -8;
LAB_0015169c:
                bVar7 = (byte)(uVar31 >> ((byte)iVar11 & 0x3f));
              }
              pbVar16[uVar24 + 0x40] = bVar7;
              uVar24 = uVar24 + 1;
            } while (uVar24 != (local_128 & 0xffffffff));
            uVar23 = local_128;
            iVar11 = local_100.at_eof;
          }
        }
        if ((iVar11 != 0) ||
           (local_128 = uVar23, local_118 = pbVar16, puVar18 = (undefined8 *)calloc(1,0x58),
           pbVar16 = local_118, puVar18 == (undefined8 *)0x0)) goto LAB_00151a3c;
        *puVar18 = prog;
        __size = 0x40;
        if (0x40 < (uint)local_128) {
          __size = local_128 & 0xffffffff;
        }
        *(int *)(puVar18 + 6) = (int)__size;
        pvVar29 = calloc(1,__size);
        pbVar16 = local_118;
        puVar18[5] = pvVar29;
        if (pvVar29 == (void *)0x0) goto LAB_00151a3c;
        if (local_118 != (byte *)0x0) {
          memcpy(pvVar29,local_118,local_128 & 0xffffffff);
        }
        puVar18[3] = CONCAT44(uStack_a4,uStack_a8);
        puVar18[4] = uStack_a0;
        puVar18[1] = local_b8;
        puVar18[2] = CONCAT44(uStack_ac,uStack_b0);
        puVar18[7] = local_90;
        *(uint32_t *)(puVar18 + 8) = local_11c;
        free(pbVar16);
        pvVar30 = local_58;
        lVar22 = local_c0;
        lVar19 = 0;
        do {
          *(undefined4 *)((long)pvVar29 + lVar19 * 4) =
               *(undefined4 *)((long)&local_b8 + lVar19 * 4);
          lVar19 = lVar19 + 1;
        } while (lVar19 != 7);
        *(char *)((long)pvVar29 + 0x1c) = (char)local_11c;
        *(char *)((long)pvVar29 + 0x1d) = (char)(local_11c >> 8);
        *(char *)((long)pvVar29 + 0x1e) = (char)(local_11c >> 0x10);
        *(char *)((long)pvVar29 + 0x1f) = (char)(local_11c >> 0x18);
        *(undefined4 *)((long)pvVar29 + 0x20) = 0;
        *(uint32_t *)((long)pvVar29 + 0x2c) = prog->usagecount;
        plVar1 = (long *)((long)local_d8 + 0x3a0);
        do {
          plVar25 = plVar1;
          lVar19 = *plVar25;
          plVar1 = (long *)(lVar19 + 0x50);
        } while (lVar19 != 0);
        *plVar25 = (long)puVar18;
        if (*(long *)(*(long *)((long)local_d8 + 0x3a0) + 0x50) == 0) {
          *(long *)((long)local_d8 + 0x3a8) = local_90;
        }
        free(local_c8);
        local_c0 = lVar22;
        if (*(long *)((long)pvVar30 + 0x3a8) < lVar22) {
          local_c0 = *(long *)((long)pvVar30 + 0x3a8);
        }
        lVar22 = *(long *)((long)pvVar3 + 0x360);
        if (local_c0 <= lVar22) {
          return local_c0;
        }
      }
    } while (*(char *)((long)pvVar3 + 0x3d2) == '\0');
  }
  return lVar22;
}

Assistant:

static int64_t
expand(struct archive_read *a, int64_t end)
{
  static const unsigned char lengthbases[] =
    {   0,   1,   2,   3,   4,   5,   6,
        7,   8,  10,  12,  14,  16,  20,
       24,  28,  32,  40,  48,  56,  64,
       80,  96, 112, 128, 160, 192, 224 };
  static const unsigned char lengthbits[] =
    { 0, 0, 0, 0, 0, 0, 0,
      0, 1, 1, 1, 1, 2, 2,
      2, 2, 3, 3, 3, 3, 4,
      4, 4, 4, 5, 5, 5, 5 };
  static const int lengthb_min = minimum(
    (int)(sizeof(lengthbases)/sizeof(lengthbases[0])),
    (int)(sizeof(lengthbits)/sizeof(lengthbits[0]))
  );
  static const unsigned int offsetbases[] =
    {       0,       1,       2,       3,       4,       6,
            8,      12,      16,      24,      32,      48,
           64,      96,     128,     192,     256,     384,
          512,     768,    1024,    1536,    2048,    3072,
         4096,    6144,    8192,   12288,   16384,   24576,
        32768,   49152,   65536,   98304,  131072,  196608,
       262144,  327680,  393216,  458752,  524288,  589824,
       655360,  720896,  786432,  851968,  917504,  983040,
      1048576, 1310720, 1572864, 1835008, 2097152, 2359296,
      2621440, 2883584, 3145728, 3407872, 3670016, 3932160 };
  static const unsigned char offsetbits[] =
    {  0,  0,  0,  0,  1,  1,  2,  2,  3,  3,  4,  4,
       5,  5,  6,  6,  7,  7,  8,  8,  9,  9, 10, 10,
      11, 11, 12, 12, 13, 13, 14, 14, 15, 15, 16, 16,
      16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16,
      18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18, 18 };
  static const int offsetb_min = minimum(
    (int)(sizeof(offsetbases)/sizeof(offsetbases[0])),
    (int)(sizeof(offsetbits)/sizeof(offsetbits[0]))
  );
  static const unsigned char shortbases[] =
    { 0, 4, 8, 16, 32, 64, 128, 192 };
  static const unsigned char shortbits[] =
    { 2, 2, 3, 4, 5, 6, 6, 6 };

  int symbol, offs, len, offsindex, lensymbol, i, offssymbol, lowoffsetsymbol;
  unsigned char newfile;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  if (rar->filters.filterstart < end)
    end = rar->filters.filterstart;

  while (1)
  {
    if(lzss_position(&rar->lzss) >= end)
      return end;

    if(rar->is_ppmd_block)
      return lzss_position(&rar->lzss);

    if ((symbol = read_next_symbol(a, &rar->maincode)) < 0)
      return (ARCHIVE_FATAL);

    if (symbol < 256)
    {
      lzss_emit_literal(rar, symbol);
      continue;
    }
    else if (symbol == 256)
    {
      if (!rar_br_read_ahead(a, br, 1))
        goto truncated_data;
      newfile = !rar_br_bits(br, 1);
      rar_br_consume(br, 1);

      if(newfile)
      {
        rar->start_new_block = 1;
        if (!rar_br_read_ahead(a, br, 1))
          goto truncated_data;
        rar->start_new_table = rar_br_bits(br, 1);
        rar_br_consume(br, 1);
        return lzss_position(&rar->lzss);
      }
      else
      {
        if (parse_codes(a) != ARCHIVE_OK)
          return (ARCHIVE_FATAL);
        continue;
      }
    }
    else if(symbol==257)
    {
      if (!read_filter(a, &end))
          return (ARCHIVE_FATAL);
      continue;
    }
    else if(symbol==258)
    {
      if(rar->lastlength == 0)
        continue;

      offs = rar->lastoffset;
      len = rar->lastlength;
    }
    else if (symbol <= 262)
    {
      offsindex = symbol - 259;
      offs = rar->oldoffset[offsindex];

      if ((lensymbol = read_next_symbol(a, &rar->lengthcode)) < 0)
        goto bad_data;
      if (lensymbol > lengthb_min)
        goto bad_data;
      len = lengthbases[lensymbol] + 2;
      if (lengthbits[lensymbol] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[lensymbol]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[lensymbol]);
        rar_br_consume(br, lengthbits[lensymbol]);
      }

      for (i = offsindex; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else if(symbol<=270)
    {
      offs = shortbases[symbol-263] + 1;
      if(shortbits[symbol-263] > 0) {
        if (!rar_br_read_ahead(a, br, shortbits[symbol-263]))
          goto truncated_data;
        offs += rar_br_bits(br, shortbits[symbol-263]);
        rar_br_consume(br, shortbits[symbol-263]);
      }

      len = 2;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }
    else
    {
      if (symbol-271 > lengthb_min)
        goto bad_data;
      len = lengthbases[symbol-271]+3;
      if(lengthbits[symbol-271] > 0) {
        if (!rar_br_read_ahead(a, br, lengthbits[symbol-271]))
          goto truncated_data;
        len += rar_br_bits(br, lengthbits[symbol-271]);
        rar_br_consume(br, lengthbits[symbol-271]);
      }

      if ((offssymbol = read_next_symbol(a, &rar->offsetcode)) < 0)
        goto bad_data;
      if (offssymbol > offsetb_min)
        goto bad_data;
      offs = offsetbases[offssymbol]+1;
      if(offsetbits[offssymbol] > 0)
      {
        if(offssymbol > 9)
        {
          if(offsetbits[offssymbol] > 4) {
            if (!rar_br_read_ahead(a, br, offsetbits[offssymbol] - 4))
              goto truncated_data;
            offs += rar_br_bits(br, offsetbits[offssymbol] - 4) << 4;
            rar_br_consume(br, offsetbits[offssymbol] - 4);
          }

          if(rar->numlowoffsetrepeats > 0)
          {
            rar->numlowoffsetrepeats--;
            offs += rar->lastlowoffset;
          }
          else
          {
            if ((lowoffsetsymbol =
              read_next_symbol(a, &rar->lowoffsetcode)) < 0)
              return (ARCHIVE_FATAL);
            if(lowoffsetsymbol == 16)
            {
              rar->numlowoffsetrepeats = 15;
              offs += rar->lastlowoffset;
            }
            else
            {
              offs += lowoffsetsymbol;
              rar->lastlowoffset = lowoffsetsymbol;
            }
          }
        }
        else {
          if (!rar_br_read_ahead(a, br, offsetbits[offssymbol]))
            goto truncated_data;
          offs += rar_br_bits(br, offsetbits[offssymbol]);
          rar_br_consume(br, offsetbits[offssymbol]);
        }
      }

      if (offs >= 0x40000)
        len++;
      if (offs >= 0x2000)
        len++;

      for(i = 3; i > 0; i--)
        rar->oldoffset[i] = rar->oldoffset[i-1];
      rar->oldoffset[0] = offs;
    }

    rar->lastoffset = offs;
    rar->lastlength = len;

    lzss_emit_match(rar, rar->lastoffset, rar->lastlength);
  }
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
bad_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Bad RAR file data");
  return (ARCHIVE_FATAL);
}